

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TransferSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *this,PageSegmentBase<Memory::VirtualAllocWrapper> *segment,
                 DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                 *fromSegmentList)

{
  SecondaryAllocator *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list;
  undefined8 *in_FS_OFFSET;
  
  list = GetSegmentList(this,segment);
  if (list != fromSegmentList) {
    if (list != (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      pSVar1 = (segment->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator;
      if (&this->fullSegments == fromSegmentList && pSVar1 != (SecondaryAllocator *)0x0) {
        iVar5 = (*pSVar1->_vptr_SecondaryAllocator[3])();
        if ((char)iVar5 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar2 = (undefined4 *)*in_FS_OFFSET;
          *puVar2 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x6d9,
                             "(segment->GetSecondaryAllocator() == nullptr || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate())"
                             ,
                             "If it\'s being moved from a full segment it should be able to do secondary allocations"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar2 = 0;
        }
      }
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::MoveElementTo
                (fromSegmentList,segment,list);
      return;
    }
    LogFreePartiallyDecommittedPageSegment(this,segment);
    DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
    RemoveElement<Memory::NoThrowHeapAllocator>
              (fromSegmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment);
    this->decommitPageCount = this->decommitPageCount - (ulong)this->maxAllocPageCount;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TransferSegment(TPageSegment * segment, DListBase<TPageSegment> * fromSegmentList)
{
    DListBase<TPageSegment> * toSegmentList = GetSegmentList(segment);

    if (fromSegmentList != toSegmentList)
    {
        if (toSegmentList)
        {
            AssertMsg(segment->GetSecondaryAllocator() == nullptr  || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate(),
                "If it's being moved from a full segment it should be able to do secondary allocations");
            fromSegmentList->MoveElementTo(segment, toSegmentList);
        }
        else
        {
            LogFreePartiallyDecommittedPageSegment(segment);
            fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
#if DBG_DUMP
            this->decommitPageCount -= maxAllocPageCount;
#endif
        }
    }
}